

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

void Gia_ManMuxProfiling(Gia_Man_t *p)

{
  Abc_Nam_t *pAVar1;
  Vec_Wec_t *p_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  Gia_Man_t *pGia;
  Mux_Man_t *p_01;
  Gia_Obj_t *pGVar6;
  Vec_Str_t *vStr;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *p_02;
  int iVar9;
  int Counter;
  uint uVar10;
  uint uVar11;
  long lVar12;
  int i;
  int fFound;
  abctime local_38;
  
  aVar5 = Abc_Clock();
  pGia = Gia_ManDupMuxes(p,2);
  uVar11 = pGia->nObjs;
  if (1 < uVar11) {
    uVar10 = uVar11 - 1;
    uVar11 = 0;
    for (; uVar10 != 0; uVar10 = uVar10 / 10) {
      uVar11 = uVar11 + 1;
    }
  }
  local_38 = aVar5;
  p_01 = Mux_ManAlloc(pGia);
  Gia_ManLevelNum(pGia);
  Gia_ManCreateRefs(pGia);
  for (iVar9 = 0; iVar9 < pGia->vCos->nSize; iVar9 = iVar9 + 1) {
    pGVar6 = Gia_ManCo(pGia,iVar9);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    Gia_ObjRefInc(pGia,pGVar6 + -(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff));
  }
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  vStr->nSize = 0;
  pcVar7 = (char *)malloc(1000);
  vStr->pArray = pcVar7;
  pVVar8 = Gia_ManFirstFanouts(pGia);
  for (lVar12 = 0; iVar9 = (int)lVar12, lVar12 < pGia->nObjs; lVar12 = lVar12 + 1) {
    pGVar6 = Gia_ManObj(pGia,iVar9);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    if ((pGia->pMuxes != (uint *)0x0) && (pGia->pMuxes[lVar12] != 0)) {
      if (pGia->pRefs[lVar12] == 1) {
        iVar2 = Vec_IntEntry(pVVar8,iVar9);
        if ((pGia->pMuxes != (uint *)0x0) && (pGia->pMuxes[iVar2] != 0)) goto LAB_001fd72d;
      }
      iVar2 = Gia_MuxStructDump(pGia,iVar9,vStr,3,uVar11);
      if (iVar2 != 1) {
        pAVar1 = p_01->pNames;
        iVar2 = Abc_NamStrFindOrAdd(pAVar1,vStr->pArray,&fFound);
        if (fFound == 0) {
          Vec_WecPushLevel(p_01->vTops);
        }
        iVar3 = Abc_NamObjNumMax(pAVar1);
        if (iVar3 != p_01->vTops->nSize) {
          __assert_fail("Abc_NamObjNumMax(pMan->pNames) == Vec_WecSize(pMan->vTops)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                        ,0x26f,"void Gia_ManMuxProfiling(Gia_Man_t *)");
        }
        p_02 = Vec_WecEntry(p_01->vTops,iVar2);
        Vec_IntPush(p_02,iVar9);
      }
    }
LAB_001fd72d:
  }
  free(vStr->pArray);
  free(vStr);
  Vec_IntFree(pVVar8);
  printf("MUX structure profile for AIG \"%s\":\n",p->pName);
  uVar11 = pGia->nMuxes;
  p_00 = p_01->vTops;
  uVar10 = 0;
  for (iVar9 = 0; iVar2 = p_00->nSize, iVar9 < iVar2; iVar9 = iVar9 + 1) {
    pVVar8 = Vec_WecEntry(p_00,iVar9);
    uVar10 = uVar10 + pVVar8->nSize;
  }
  pAVar1 = p_01->pNames;
  iVar9 = Abc_NamMemUsed(pAVar1);
  iVar3 = 0x76249e;
  printf("Total MUXes = %d.  Total trees = %d.  Unique trees = %d.  Memory = %.2f MB   ",
         (double)iVar9 * 9.5367431640625e-07,(ulong)uVar11,(ulong)uVar10,(ulong)(iVar2 - 1));
  aVar5 = Abc_Clock();
  lVar12 = aVar5 - local_38;
  Abc_Print(iVar3,"%s =","Time");
  Abc_Print(iVar3,"%9.2f sec\n",(double)lVar12 / 1000000.0);
  iVar9 = Gia_ManMuxProfile(p_01,0);
  if (iVar9 != 0) {
    uVar11 = 1;
    Gia_ManMuxProfile(p_01,1);
    printf("The first %d structures: \n",10);
    while( true ) {
      iVar9 = p_00->nSize;
      iVar2 = 10;
      if (iVar9 < 10) {
        iVar2 = iVar9;
      }
      if (iVar2 <= (int)uVar11) break;
      pVVar8 = Vec_WecEntry(p_00,uVar11);
      pcVar7 = Abc_NamStr(pAVar1,uVar11);
      printf("%5d : ",(ulong)uVar11);
      printf("Occur = %4d   ",(ulong)(uint)pVVar8->nSize);
      uVar10 = atoi(pcVar7);
      printf("Size = %4d   ",(ulong)uVar10);
      puts(pcVar7);
      uVar11 = uVar11 + 1;
    }
    iVar2 = 0;
    for (uVar11 = 1; (int)uVar11 < iVar9; uVar11 = uVar11 + 1) {
      pVVar8 = Vec_WecEntry(p_00,uVar11);
      pcVar7 = Abc_NamStr(pAVar1,uVar11);
      uVar10 = pVVar8->nSize;
      if (5 < (int)uVar10) {
        uVar4 = atoi(pcVar7);
        if (5 < (int)uVar4) {
          printf("For example, structure %d has %d MUXes and bit-width %d:\n",(ulong)uVar11,
                 (ulong)uVar4,(ulong)uVar10);
          for (iVar9 = 0; iVar9 < pVVar8->nSize; iVar9 = iVar9 + 1) {
            iVar3 = Vec_IntEntry(pVVar8,iVar9);
            Gia_MuxStructPrint(pGia,iVar3);
          }
          iVar2 = iVar2 + 1;
          if (iVar2 == 5) break;
        }
      }
      iVar9 = p_00->nSize;
    }
  }
  Mux_ManFree(p_01);
  Gia_ManStop(pGia);
  return;
}

Assistant:

void Gia_ManMuxProfiling( Gia_Man_t * p )
{
    Mux_Man_t * pMan;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Str_t * vStr;
    Vec_Int_t * vFans, * vVec;
    int i, Counter, fFound, iStructId, nDigitsId;
    abctime clk = Abc_Clock();

    pNew = Gia_ManDupMuxes( p, 2 );
    nDigitsId = Abc_Base10Log( Gia_ManObjNum(pNew) );

    pMan = Mux_ManAlloc( pNew );
     
    Gia_ManLevelNum( pNew );
    Gia_ManCreateRefs( pNew );
    Gia_ManForEachCo( pNew, pObj, i )
        Gia_ObjRefFanin0Inc( pNew, pObj );

    vStr = Vec_StrAlloc( 1000 );
    vFans = Gia_ManFirstFanouts( pNew );
    Gia_ManForEachMux( pNew, pObj, i )
    {
        // skip MUXes in the middle of the tree (which have only one MUX fanout)
        if ( Gia_ObjRefNumId(pNew, i) == 1 && Gia_ObjIsMuxId(pNew, Vec_IntEntry(vFans, i)) )
            continue;
        // this node is the root of the MUX structure - create hash key
        Counter = Gia_MuxStructDump( pNew, i, vStr, 3, nDigitsId );
        if ( Counter == 1 )
            continue;
        iStructId = Abc_NamStrFindOrAdd( pMan->pNames, Vec_StrArray(vStr), &fFound );
        if ( !fFound )
            Vec_WecPushLevel( pMan->vTops );
        assert( Abc_NamObjNumMax(pMan->pNames) == Vec_WecSize(pMan->vTops) );
        Vec_IntPush( Vec_WecEntry(pMan->vTops, iStructId), i );
    }
    Vec_StrFree( vStr );
    Vec_IntFree( vFans );

    printf( "MUX structure profile for AIG \"%s\":\n", p->pName );
    printf( "Total MUXes = %d.  Total trees = %d.  Unique trees = %d.  Memory = %.2f MB   ", 
        Gia_ManMuxNum(pNew), Vec_WecSizeSize(pMan->vTops), Vec_WecSize(pMan->vTops)-1, 
        1.0*Abc_NamMemUsed(pMan->pNames)/(1<<20) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    if ( Gia_ManMuxProfile(pMan, 0) )
    {
        Gia_ManMuxProfile( pMan, 1 );

        // short the first ones
        printf( "The first %d structures: \n", 10 );
        Vec_WecForEachLevelStartStop( pMan->vTops, vVec, i, 1, Abc_MinInt(Vec_WecSize(pMan->vTops), 10) )
        {
            char * pTemp = Abc_NamStr(pMan->pNames, i);
            printf( "%5d : ", i );
            printf( "Occur = %4d   ", Vec_IntSize(vVec) );
            printf( "Size = %4d   ", atoi(pTemp) );
            printf( "%s\n", pTemp );
        }

        // print trees for the first one
        Counter = 0;
        Vec_WecForEachLevelStart( pMan->vTops, vVec, i, 1 )
        {
            char * pTemp = Abc_NamStr(pMan->pNames, i);
            if ( Vec_IntSize(vVec) > 5 && atoi(pTemp) > 5 )
            {
                int k, Entry;
                printf( "For example, structure %d has %d MUXes and bit-width %d:\n", i, atoi(pTemp), Vec_IntSize(vVec) );
                Vec_IntForEachEntry( vVec, Entry, k )
                    Gia_MuxStructPrint( pNew, Entry );
                if ( ++Counter == 5 )
                    break;
            }
        }
    }

    Mux_ManFree( pMan );
    Gia_ManStop( pNew );
}